

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O3

void array_random_bang(t_array_random *x)

{
  int iVar1;
  uint uVar2;
  int arrayonset;
  int nitem;
  int stride;
  char *firstitem;
  int local_1c;
  int local_18;
  int local_14;
  char *local_10;
  
  iVar1 = array_rangeop_getrange(&x->x_r,&local_10,&local_18,&local_14,&local_1c);
  if (iVar1 != 0) {
    uVar2 = x->x_state * 0x1c307df1 + 0x319da917;
    x->x_state = uVar2;
    array_quantile_float(&x->x_r,(float)((double)uVar2 * 2.3283064365386963e-10));
    return;
  }
  return;
}

Assistant:

static void array_random_bang(t_array_random *x)
{
    char *firstitem;
    int stride, nitem, arrayonset;

    if (!array_rangeop_getrange(&x->x_r, &firstitem, &nitem, &stride,
        &arrayonset))
            return;
    x->x_state = x->x_state * 472940017 + 832416023;
    array_quantile_float(&x->x_r, (1./4294967296.0) * (double)(x->x_state));
}